

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bn_lib.c
# Opt level: O2

int bn_cmp_part_words(unsigned_long *a,unsigned_long *b,int cl,int dl)

{
  long lVar1;
  int iVar2;
  ulong uVar3;
  long lVar4;
  
  if (dl < 0) {
    iVar2 = -1;
    lVar4 = -(long)dl;
    do {
      if (lVar4 == 0) goto LAB_001120a7;
      lVar1 = (cl + -1) + lVar4;
      lVar4 = lVar4 + -1;
    } while (b[lVar1] == 0);
  }
  else {
LAB_001120a7:
    if (dl < 1) {
LAB_001120c6:
      iVar2 = bn_cmp_words(a,b,cl);
      return iVar2;
    }
    uVar3 = (ulong)(uint)dl;
    iVar2 = 1;
    do {
      if ((long)uVar3 < 1) goto LAB_001120c6;
      lVar4 = (long)(cl + -1) + uVar3;
      uVar3 = uVar3 - 1;
    } while (a[lVar4] == 0);
  }
  return iVar2;
}

Assistant:

int bn_cmp_part_words(const BN_ULONG *a, const BN_ULONG *b, int cl, int dl)
{
    int n, i;
    n = cl - 1;

    if (dl < 0) {
        for (i = dl; i < 0; i++) {
            if (b[n - i] != 0)
                return -1;      /* a < b */
        }
    }
    if (dl > 0) {
        for (i = dl; i > 0; i--) {
            if (a[n + i] != 0)
                return 1;       /* a > b */
        }
    }
    return bn_cmp_words(a, b, cl);
}